

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall.c
# Opt level: O2

int metacall_register(char *name,_func_void_ptr_size_t_void_ptr_ptr_void_ptr *invoke,void **func,
                     metacall_value_id return_type,size_t size,...)

{
  char in_AL;
  uint uVar1;
  int iVar2;
  type_id *ptVar3;
  undefined8 in_R9;
  size_t sVar4;
  type_id *ptVar5;
  ulong uVar6;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list va;
  type_id types [16];
  type_id local_b8 [10];
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  undefined8 local_18;
  
  local_90 = in_R9;
  if (in_AL != '\0') {
    local_88 = in_XMM0_Qa;
    local_78 = in_XMM1_Qa;
    local_68 = in_XMM2_Qa;
    local_58 = in_XMM3_Qa;
    local_48 = in_XMM4_Qa;
    local_38 = in_XMM5_Qa;
    local_28 = in_XMM6_Qa;
    local_18 = in_XMM7_Qa;
  }
  uVar1 = 0x28;
  ptVar5 = (type_id *)&stack0x00000008;
  for (sVar4 = 0; size != sVar4; sVar4 = sVar4 + 1) {
    if (uVar1 < 0x29) {
      uVar6 = (ulong)uVar1;
      uVar1 = uVar1 + 8;
      ptVar3 = ptVar5;
      ptVar5 = (type_id *)((long)local_b8 + uVar6);
    }
    else {
      ptVar3 = ptVar5 + 2;
    }
    types[sVar4] = *ptVar5;
    ptVar5 = ptVar3;
  }
  iVar2 = loader_register(name,(loader_register_invoke)invoke,(function *)func,return_type,size,
                          types);
  return iVar2;
}

Assistant:

int metacall_register(const char *name, void *(*invoke)(size_t, void *[], void *), void **func, enum metacall_value_id return_type, size_t size, ...)
{
	type_id types[METACALL_ARGS_SIZE];

	va_list va;

	va_start(va, size);

	size_t iterator;

	for (iterator = 0; iterator < size; ++iterator)
	{
		types[iterator] = (type_id)va_arg(va, int);
	}

	va_end(va);

	return loader_register(name, (loader_register_invoke)invoke, (function *)func, (type_id)return_type, size, (type_id *)types);
}